

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int inputPush(xmlParserCtxtPtr ctxt,xmlParserInputPtr value)

{
  int iVar1;
  xmlParserInputPtr *ppxVar2;
  int iVar3;
  
  iVar3 = -1;
  if (value != (xmlParserInputPtr)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    iVar3 = ctxt->inputNr;
    iVar1 = ctxt->inputMax;
    if (iVar3 < iVar1) {
      ppxVar2 = ctxt->inputTab;
    }
    else {
      ctxt->inputMax = iVar1 * 2;
      ppxVar2 = (xmlParserInputPtr *)(*xmlRealloc)(ctxt->inputTab,(long)iVar1 << 4);
      ctxt->inputTab = ppxVar2;
      if (ppxVar2 == (xmlParserInputPtr *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        ctxt->inputMax = ctxt->inputMax / 2;
        return -1;
      }
      iVar3 = ctxt->inputNr;
    }
    ppxVar2[iVar3] = value;
    ctxt->input = value;
    ctxt->inputNr = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int
inputPush(xmlParserCtxtPtr ctxt, xmlParserInputPtr value)
{
    if ((ctxt == NULL) || (value == NULL))
        return(-1);
    if (ctxt->inputNr >= ctxt->inputMax) {
        ctxt->inputMax *= 2;
        ctxt->inputTab =
            (xmlParserInputPtr *) xmlRealloc(ctxt->inputTab,
                                             ctxt->inputMax *
                                             sizeof(ctxt->inputTab[0]));
        if (ctxt->inputTab == NULL) {
            xmlErrMemory(ctxt, NULL);
	    ctxt->inputMax /= 2;
            return (-1);
        }
    }
    ctxt->inputTab[ctxt->inputNr] = value;
    ctxt->input = value;
    return (ctxt->inputNr++);
}